

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

uint32 __thiscall
Protocol::MQTT::V5::ControlPacketSerializableImpl::readFrom
          (ControlPacketSerializableImpl *this,uint8 *buffer,uint32 bufLength)

{
  ushort uVar1;
  SerializablePayload *pSVar2;
  ushort uVar3;
  uint32 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint8 *puVar10;
  
  uVar7 = 0xfffffffe;
  if (1 < bufLength) {
    this->header->typeAndFlags = *buffer;
    (this->remLength).size = 0;
    do {
      uVar1 = (this->remLength).size;
      if (bufLength - 1 <= (uint)uVar1) {
        uVar9 = 0xfffffffe;
        goto LAB_00107301;
      }
      (this->remLength).field_0.value[uVar1] = buffer[(ulong)uVar1 + 1];
      uVar1 = (this->remLength).size;
      uVar3 = uVar1 + 1;
      (this->remLength).size = uVar3;
      if (-1 < (char)(this->remLength).field_0.value[uVar1]) {
        uVar9 = (uint)uVar3;
        goto LAB_00107301;
      }
    } while (uVar3 != 4);
    uVar9 = 0xffffffff;
LAB_00107301:
    uVar7 = uVar9;
    if (uVar9 < 0xfffffffd) {
      uVar8 = (bufLength - 1) - uVar9;
      uVar4 = Common::VBInt::operator_cast_to_unsigned_int(&this->remLength);
      uVar7 = 0xfffffffe;
      if (uVar4 <= uVar8) {
        puVar10 = buffer + (ulong)uVar9 + 1;
        (*(this->fixedVariableHeader->super_Serializable)._vptr_Serializable[6])
                  (this->fixedVariableHeader,(ulong)uVar4);
        uVar5 = (*(this->fixedVariableHeader->super_Serializable)._vptr_Serializable[2])
                          (this->fixedVariableHeader,puVar10,(ulong)uVar8);
        if (uVar5 < 0xfffffffd) {
          uVar6 = (*(this->props->super_Serializable)._vptr_Serializable[2])
                            (this->props,puVar10 + uVar5,(ulong)(uVar8 - uVar5));
          uVar7 = uVar6;
          if (uVar6 < 0xfffffffd) {
            pSVar2 = this->payload;
            uVar7 = (*(this->super_ControlPacketSerializable).super_Serializable._vptr_Serializable
                      [5])(this,0);
            (*(pSVar2->super_EmptySerializable).super_Serializable._vptr_Serializable[6])
                      (pSVar2,(ulong)uVar7);
            uVar7 = (*(this->payload->super_EmptySerializable).super_Serializable._vptr_Serializable
                      [2])(this->payload,puVar10 + uVar5 + uVar6,(ulong)((uVar8 - uVar5) - uVar6));
            if (uVar7 < 0xfffffffd) {
              uVar7 = uVar5 + uVar9 + 1 + uVar6 + uVar7;
            }
          }
        }
        else {
          uVar7 = uVar4 + uVar9 + 1;
          if (uVar5 != 0xfffffffd) {
            uVar7 = uVar5;
          }
        }
      }
    }
  }
  return uVar7;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if (bufLength < 2) return NotEnoughData;
                    uint32 o = 1; const_cast<uint8&>(header.typeAndFlags) = buffer[0];

                    buffer += o; bufLength -= o;

                    uint32 s = remLength.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;
                    uint32 expLength = (uint32)remLength;
                    if (bufLength < expLength) return NotEnoughData;

                    fixedVariableHeader.setRemainingLength(expLength);
                    s = fixedVariableHeader.readFrom(buffer, bufLength);
                    if (isError(s)) return isShortcut(s) ? o + expLength : s;
                    o += s; buffer += s; bufLength -= s;

                    s = props.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;

                    payload.setExpectedPacketSize(computePacketSize(false));
                    s = payload.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    return o + s;
                }